

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoSimdRelaxedNmadd<double>(Thread *this)

{
  u8 i;
  long lVar1;
  Simd<double,_(unsigned_char)__x02_> SVar2;
  SS result;
  Simd<double,_(unsigned_char)__x02_> a;
  Simd<double,_(unsigned_char)__x02_> b;
  Simd<double,_(unsigned_char)__x02_> c;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  double local_38 [2];
  double local_28 [2];
  double local_18 [2];
  
  local_18 = (double  [2])Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  local_28 = (double  [2])Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  SVar2 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  local_38[0] = SVar2.v[0];
  local_38[1] = SVar2.v[1];
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    *(double *)((long)&local_48 + lVar1 * 8) = local_18[lVar1] - local_38[lVar1] * local_28[lVar1];
  }
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdRelaxedNmadd() {
  using SS = typename Simd128<S>::Type;
  auto c = Pop<SS>();
  auto b = Pop<SS>();
  auto a = Pop<SS>();
  SS result;
  for (u8 i = 0; i < SS::lanes; ++i) {
    result[i] = -(a[i] * b[i]) + c[i];
  }
  Push(result);
  return RunResult::Ok;
}